

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

data_ptr * cpptempl::make_data(string *val)

{
  DataValue *in_RSI;
  string *in_RDI;
  DataValue *in_stack_ffffffffffffff98;
  string *value;
  string local_30 [48];
  
  value = in_RDI;
  operator_new(0x28);
  std::__cxx11::string::string(local_30,(string *)in_RSI);
  DataValue::DataValue(in_RSI,value);
  data_ptr::data_ptr((data_ptr *)in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  return (data_ptr *)value;
}

Assistant:

inline data_ptr make_data(std::string val)
    {
        return data_ptr(new DataValue(val)) ;
    }